

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_graph.cpp
# Opt level: O2

ListGraph * load_pace_graph_impl(ListGraph *__return_storage_ptr__,istream *in)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  istream *piVar5;
  istream *piVar6;
  long *plVar7;
  runtime_error *prVar8;
  int iVar9;
  int iVar10;
  int __val;
  int __val_00;
  int t;
  int h;
  string sp;
  string p;
  int arc_count;
  int node_count;
  string line;
  ListGraph local_1e0;
  istringstream lin;
  
  (__return_storage_ptr__->head).super_ArrayIDFunc<int>.preimage_count_ = 0;
  (__return_storage_ptr__->head).super_ArrayIDFunc<int>.data_ = (int *)0x0;
  (__return_storage_ptr__->head).image_count_ = 0;
  (__return_storage_ptr__->tail).super_ArrayIDFunc<int>.preimage_count_ = 0;
  (__return_storage_ptr__->tail).super_ArrayIDFunc<int>.data_ = (int *)0x0;
  (__return_storage_ptr__->tail).image_count_ = 0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  __val = 0;
  __val_00 = 0;
  bVar3 = false;
  while( true ) {
    do {
      __val = __val + 1;
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>(in,(string *)&line);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
        if (__val_00 == (__return_storage_ptr__->head).super_ArrayIDFunc<int>.preimage_count_) {
          std::__cxx11::string::~string((string *)&line);
          return __return_storage_ptr__;
        }
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string
                  ((string *)&node_count,
                   (__return_storage_ptr__->head).super_ArrayIDFunc<int>.preimage_count_);
        std::operator+(&sp,"The arc count in the header (",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &node_count);
        std::operator+(&p,&sp,") does not correspond with the actual number of arcs (");
        std::__cxx11::to_string((string *)&arc_count,__val_00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e0,&p,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &arc_count);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lin,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1e0,").");
        std::runtime_error::runtime_error(prVar8,(string *)&lin);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    } while ((line._M_string_length == 0) || (*line._M_dataplus._M_p == 'c'));
    std::__cxx11::istringstream::istringstream((istringstream *)&lin,(string *)&line,_S_in);
    if (!bVar3) break;
    piVar6 = (istream *)std::istream::operator>>((istream *)&lin,&t);
    plVar7 = (long *)std::istream::operator>>(piVar6,&h);
    if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string((string *)&arc_count,__val);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &node_count,"Can not parse line num ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arc_count
                    );
      std::operator+(&sp,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &node_count," \"");
      std::operator+(&p,&sp,&line);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e0
                     ,&p,"\" in pace file.");
      std::runtime_error::runtime_error(prVar8,(string *)&local_1e0);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar9 = h + -1;
    uVar4 = t - 1;
    if (((h < 1) || (uVar2 = (__return_storage_ptr__->head).image_count_, (int)uVar2 < h)) ||
       ((t < 1 || (uVar2 <= uVar4)))) {
      t = uVar4;
      h = iVar9;
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string((string *)&arc_count,__val);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &node_count,"Invalid arc in line num ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arc_count
                    );
      std::operator+(&sp,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &node_count," \"");
      std::operator+(&p,&sp,&line);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e0
                     ,&p,"\" in pace file.");
      std::runtime_error::runtime_error(prVar8,(string *)&local_1e0);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar10 = (__return_storage_ptr__->head).super_ArrayIDFunc<int>.preimage_count_;
    if (__val_00 < iVar10) {
      (__return_storage_ptr__->head).super_ArrayIDFunc<int>.data_[__val_00] = iVar9;
      (__return_storage_ptr__->tail).super_ArrayIDFunc<int>.data_[__val_00] = uVar4;
      iVar10 = (__return_storage_ptr__->head).super_ArrayIDFunc<int>.preimage_count_;
    }
    iVar1 = __val_00 + 1;
    if (iVar1 < iVar10) {
      (__return_storage_ptr__->head).super_ArrayIDFunc<int>.data_[iVar1] = uVar4;
      (__return_storage_ptr__->tail).super_ArrayIDFunc<int>.data_[iVar1] = iVar9;
    }
    __val_00 = __val_00 + 2;
    t = uVar4;
    h = iVar9;
LAB_0012e633:
    std::__cxx11::istringstream::~istringstream((istringstream *)&lin);
    bVar3 = true;
  }
  p._M_dataplus._M_p = (pointer)&p.field_2;
  p._M_string_length = 0;
  p.field_2._M_local_buf[0] = '\0';
  sp._M_dataplus._M_p = (pointer)&sp.field_2;
  sp._M_string_length = 0;
  sp.field_2._M_local_buf[0] = '\0';
  piVar5 = std::operator>>((istream *)&lin,(string *)&p);
  piVar5 = std::operator>>(piVar5,(string *)&sp);
  piVar6 = (istream *)std::istream::operator>>((istream *)piVar5,&node_count);
  plVar7 = (long *)std::istream::operator>>(piVar6,&arc_count);
  if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"Can not parse header in pace file.");
    goto LAB_0012e89c;
  }
  bVar3 = std::operator!=(&p,"p");
  if (!bVar3) {
    bVar3 = std::operator!=(&sp,"tdp");
    if (((!bVar3) && (-1 < node_count)) && (-1 < arc_count)) {
      ListGraph::ListGraph(&local_1e0,node_count,arc_count * 2);
      ListGraph::operator=(__return_storage_ptr__,&local_1e0);
      ListGraph::~ListGraph(&local_1e0);
      std::__cxx11::string::~string((string *)&sp);
      std::__cxx11::string::~string((string *)&p);
      goto LAB_0012e633;
    }
  }
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar8,"Invalid header in pace file.");
LAB_0012e89c:
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static ListGraph load_pace_graph_impl(std::istream& in)
{
    ListGraph graph;
    std::string line;
    int line_num = 0;
    int next_arc = 0;

    bool was_header_read = false;
    while (std::getline(in, line)) {
        ++line_num;
        if (line.empty() || line[0] == 'c')
            continue;

        std::istringstream lin(line);
        if (!was_header_read) {
            was_header_read = true;
            std::string p, sp;
            int node_count;
            int arc_count;
            if (!(lin >> p >> sp >> node_count >> arc_count))
                throw std::runtime_error("Can not parse header in pace file.");
            if (p != "p" || sp != "tdp" || node_count < 0 || arc_count < 0)
                throw std::runtime_error("Invalid header in pace file.");
            graph = ListGraph(node_count, 2 * arc_count);
        } else {
            int h, t;
            if (!(lin >> t >> h))
                throw std::runtime_error("Can not parse line num " + std::to_string(line_num) + " \"" + line + "\" in pace file.");
            --h;
            --t;
            if (h < 0 || h >= graph.node_count() || t < 0 || t >= graph.node_count())
                throw std::runtime_error("Invalid arc in line num " + std::to_string(line_num) + " \"" + line + "\" in pace file.");
            if (next_arc < graph.arc_count()) {
                graph.head[next_arc] = h;
                graph.tail[next_arc] = t;
            }
            ++next_arc;
            if (next_arc < graph.arc_count()) {
                graph.head[next_arc] = t;
                graph.tail[next_arc] = h;
            }
            ++next_arc;
        }
    }

    if (next_arc != graph.arc_count())
        throw std::runtime_error(
            "The arc count in the header (" + std::to_string(graph.arc_count()) + ") does not correspond with the actual number of arcs (" + std::to_string(next_arc) + ").");

    return graph; // NVRO
}